

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qsyntaxhighlighter.cpp
# Opt level: O1

void QSyntaxHighlighter::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QSyntaxHighlighterPrivate *this;
  long lVar1;
  
  if (_c == InvokeMetaMethod) {
    switch(_id) {
    case 0:
      rehighlight((QSyntaxHighlighter *)_o);
      return;
    case 1:
      rehighlightBlock((QSyntaxHighlighter *)_o,(QTextBlock *)_a[1]);
      return;
    case 2:
      this = *(QSyntaxHighlighterPrivate **)(_o + 8);
      if ((this->inReformatBlocks == false) && (this->rehighlightPending == false)) {
        QSyntaxHighlighterPrivate::reformatBlocks(this,*_a[1],*_a[2],*_a[3]);
        return;
      }
      break;
    case 3:
      lVar1 = *(long *)(_o + 8);
      if (*(char *)(lVar1 + 0xb0) == '\x01') {
        *(undefined1 *)(lVar1 + 0xb0) = 0;
        rehighlight(*(QSyntaxHighlighter **)(lVar1 + 8));
        return;
      }
    }
  }
  return;
}

Assistant:

void QSyntaxHighlighter::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QSyntaxHighlighter *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->rehighlight(); break;
        case 1: _t->rehighlightBlock((*reinterpret_cast< std::add_pointer_t<QTextBlock>>(_a[1]))); break;
        case 2: _t->d_func()->_q_reformatBlocks((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 3: _t->d_func()->_q_delayedRehighlight(); break;
        default: ;
        }
    }
}